

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

ElementsDecodeIssuanceStruct * __thiscall
cfd::api::json::ElementsDecodeIssuance::ConvertToStruct(ElementsDecodeIssuance *this)

{
  long in_RSI;
  ElementsDecodeIssuanceStruct *in_RDI;
  ElementsDecodeIssuanceStruct *result;
  ElementsDecodeIssuanceStruct *in_stack_00000070;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  ElementsDecodeIssuanceStruct *this_00;
  
  this_00 = in_RDI;
  ElementsDecodeIssuanceStruct::ElementsDecodeIssuanceStruct(in_stack_00000070);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)(in_RSI + 0x38));
  std::__cxx11::string::operator=((string *)&in_RDI->asset_entropy,(string *)(in_RSI + 0x58));
  std::__cxx11::string::operator=((string *)&in_RDI->contract_hash,(string *)(in_RSI + 0x78));
  in_RDI->isreissuance = (bool)(*(byte *)(in_RSI + 0x98) & 1);
  std::__cxx11::string::operator=((string *)&in_RDI->token,(string *)(in_RSI + 0xa0));
  std::__cxx11::string::operator=((string *)&in_RDI->asset,(string *)(in_RSI + 0xc0));
  in_RDI->assetamount = *(int64_t *)(in_RSI + 0xe0);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->assetamountcommitment,(string *)(in_RSI + 0xe8));
  in_RDI->tokenamount = *(int64_t *)(in_RSI + 0x108);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->tokenamountcommitment,(string *)(in_RSI + 0x110));
  std::__cxx11::string::operator=((string *)&in_RDI->asset_rangeproof,(string *)(in_RSI + 0x130));
  std::__cxx11::string::operator=((string *)&in_RDI->token_rangeproof,(string *)(in_RSI + 0x150));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

ElementsDecodeIssuanceStruct ElementsDecodeIssuance::ConvertToStruct() const {  // NOLINT
  ElementsDecodeIssuanceStruct result;
  result.asset_blinding_nonce = asset_blinding_nonce_;
  result.asset_entropy = asset_entropy_;
  result.contract_hash = contract_hash_;
  result.isreissuance = isreissuance_;
  result.token = token_;
  result.asset = asset_;
  result.assetamount = assetamount_;
  result.assetamountcommitment = assetamountcommitment_;
  result.tokenamount = tokenamount_;
  result.tokenamountcommitment = tokenamountcommitment_;
  result.asset_rangeproof = asset_rangeproof_;
  result.token_rangeproof = token_rangeproof_;
  result.ignore_items = ignore_items;
  return result;
}